

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::SampleMaskInstance::iterate
          (TestStatus *__return_storage_ptr__,SampleMaskInstance *this)

{
  allocator<unsigned_int> *paVar1;
  void *pvVar2;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> data;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> data_00;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> data_01;
  int iVar3;
  TextureLevel *pTVar4;
  MultisampleRenderer *pMVar5;
  VkPipelineColorBlendAttachmentState *pVVar6;
  PixelBufferAccess local_9e0;
  PixelBufferAccess local_9b8;
  PixelBufferAccess local_990;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_968;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *local_958;
  undefined1 local_948 [8];
  MultisampleRenderer renderer_2;
  undefined1 local_690 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampleMask_1;
  VkPipelineMultisampleStateCreateInfo multisampleParams_1;
  undefined1 local_628 [8];
  MultisampleRenderer renderer_1;
  undefined1 local_370 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampleMask;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  undefined1 local_308 [8];
  MultisampleRenderer renderer;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> maxSampleMaskImage;
  undefined1 local_38 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> minSampleMaskImage;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> testSampleMaskImage;
  SampleMaskInstance *this_local;
  
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &minSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              field_0x8);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_38);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
              m_allocator);
  pTVar4 = (TextureLevel *)&this->m_multisampleStateParams;
  pVVar6 = &this->m_colorBlendState;
  MultisampleRenderer::MultisampleRenderer
            ((MultisampleRenderer *)local_308,(this->super_TestInstance).m_context,
             this->m_colorFormat,&this->m_renderSize,this->m_primitiveTopology,&this->m_vertices,
             (VkPipelineMultisampleStateCreateInfo *)pTVar4,pVVar6);
  pMVar5 = (MultisampleRenderer *)local_308;
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams.alphaToCoverageEnable,pMVar5);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams.alphaToCoverageEnable,(MovePtr *)pMVar5);
  data._8_8_ = pVVar6;
  data.ptr = pTVar4;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::operator=
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &minSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              field_0x8,data);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams.alphaToCoverageEnable);
  MultisampleRenderer::~MultisampleRenderer((MultisampleRenderer *)local_308);
  sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&this->m_multisampleStateParams;
  multisampleParams._0_8_ = (this->m_multisampleStateParams).pNext;
  pvVar2 = *(void **)&(this->m_multisampleStateParams).flags;
  multisampleParams.flags = (this->m_multisampleStateParams).sampleShadingEnable;
  multisampleParams.rasterizationSamples =
       (VkSampleCountFlagBits)(this->m_multisampleStateParams).minSampleShading;
  multisampleParams._24_8_ = (this->m_multisampleStateParams).pSampleMask;
  multisampleParams.pSampleMask =
       *(VkSampleMask **)&(this->m_multisampleStateParams).alphaToCoverageEnable;
  multisampleParams.pNext._4_4_ = (int)((ulong)pvVar2 >> 0x20);
  iVar3 = multisampleParams.pNext._4_4_;
  if ((long)pvVar2 < 0) {
    iVar3 = multisampleParams.pNext._4_4_ + 0x1f;
  }
  renderer_1.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&renderer_1.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                   m_allocator + 3);
  multisampleParams.pNext = pvVar2;
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,(long)(iVar3 >> 5),
             (value_type_conflict1 *)
             ((long)&renderer_1.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter
                     .m_allocator + 4),paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&renderer_1.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter
                     .m_allocator + 3));
  multisampleParams._24_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
  pVVar6 = &this->m_colorBlendState;
  pTVar4 = (TextureLevel *)
           &sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  MultisampleRenderer::MultisampleRenderer
            ((MultisampleRenderer *)local_628,(this->super_TestInstance).m_context,
             this->m_colorFormat,&this->m_renderSize,this->m_primitiveTopology,&this->m_vertices,
             (VkPipelineMultisampleStateCreateInfo *)pTVar4,pVVar6);
  pMVar5 = (MultisampleRenderer *)local_628;
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams_1.alphaToCoverageEnable,pMVar5);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams_1.alphaToCoverageEnable,(MovePtr *)pMVar5);
  data_00._8_8_ = pVVar6;
  data_00.ptr = pTVar4;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::operator=
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_38,data_00)
  ;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams_1.alphaToCoverageEnable);
  MultisampleRenderer::~MultisampleRenderer((MultisampleRenderer *)local_628);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
  sampleMask_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&this->m_multisampleStateParams;
  multisampleParams_1._0_8_ = (this->m_multisampleStateParams).pNext;
  pvVar2 = *(void **)&(this->m_multisampleStateParams).flags;
  multisampleParams_1.flags = (this->m_multisampleStateParams).sampleShadingEnable;
  multisampleParams_1.rasterizationSamples =
       (VkSampleCountFlagBits)(this->m_multisampleStateParams).minSampleShading;
  multisampleParams_1._24_8_ = (this->m_multisampleStateParams).pSampleMask;
  multisampleParams_1.pSampleMask =
       *(VkSampleMask **)&(this->m_multisampleStateParams).alphaToCoverageEnable;
  multisampleParams_1.pNext._4_4_ = (int)((ulong)pvVar2 >> 0x20);
  iVar3 = multisampleParams_1.pNext._4_4_;
  if ((long)pvVar2 < 0) {
    iVar3 = multisampleParams_1.pNext._4_4_ + 0x1f;
  }
  renderer_2.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_
       = 0xffffffff;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&renderer_2.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                   m_allocator + 3);
  multisampleParams_1.pNext = pvVar2;
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_690,(long)(iVar3 >> 5),
             (value_type_conflict1 *)
             ((long)&renderer_2.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter
                     .m_allocator + 4),paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&renderer_2.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter
                     .m_allocator + 3));
  multisampleParams_1._24_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_690);
  pVVar6 = &this->m_colorBlendState;
  pTVar4 = (TextureLevel *)
           &sampleMask_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  MultisampleRenderer::MultisampleRenderer
            ((MultisampleRenderer *)local_948,(this->super_TestInstance).m_context,
             this->m_colorFormat,&this->m_renderSize,this->m_primitiveTopology,&this->m_vertices,
             (VkPipelineMultisampleStateCreateInfo *)pTVar4,pVVar6);
  pMVar5 = (MultisampleRenderer *)local_948;
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_968,pMVar5
            );
  local_958 = de::details::MovePtr::operator_cast_to_PtrData(&local_968,(MovePtr *)pMVar5);
  data_01._8_8_ = pVVar6;
  data_01.ptr = pTVar4;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::operator=
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
              m_allocator,data_01);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_968);
  MultisampleRenderer::~MultisampleRenderer((MultisampleRenderer *)local_948);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_690);
  pTVar4 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &minSampleMaskImage.
                       super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                       m_data.field_0x8);
  tcu::TextureLevel::getAccess(&local_990,pTVar4);
  pTVar4 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_38);
  tcu::TextureLevel::getAccess(&local_9b8,pTVar4);
  pTVar4 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter
                       .m_allocator);
  tcu::TextureLevel::getAccess(&local_9e0,pTVar4);
  (*(this->super_TestInstance)._vptr_TestInstance[3])
            (__return_storage_ptr__,this,&local_990,&local_9b8,&local_9e0);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
              m_allocator);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_38);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &minSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SampleMaskInstance::iterate (void)
{
	de::MovePtr<tcu::TextureLevel>				testSampleMaskImage;
	de::MovePtr<tcu::TextureLevel>				minSampleMaskImage;
	de::MovePtr<tcu::TextureLevel>				maxSampleMaskImage;

	// Render with test flags
	{
		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, m_multisampleStateParams, m_colorBlendState);
		testSampleMaskImage = renderer.render();
	}

	// Render with all flags off
	{
		VkPipelineMultisampleStateCreateInfo	multisampleParams	= m_multisampleStateParams;
		const std::vector<VkSampleMask>			sampleMask			(multisampleParams.rasterizationSamples / 32, (VkSampleMask)0);

		multisampleParams.pSampleMask = sampleMask.data();

		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, multisampleParams, m_colorBlendState);
		minSampleMaskImage = renderer.render();
	}

	// Render with all flags on
	{
		VkPipelineMultisampleStateCreateInfo	multisampleParams	= m_multisampleStateParams;
		const std::vector<VkSampleMask>			sampleMask			(multisampleParams.rasterizationSamples / 32, ~((VkSampleMask)0));

		multisampleParams.pSampleMask = sampleMask.data();

		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, multisampleParams, m_colorBlendState);
		maxSampleMaskImage = renderer.render();
	}

	return verifyImage(testSampleMaskImage->getAccess(), minSampleMaskImage->getAccess(), maxSampleMaskImage->getAccess());
}